

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O3

ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *state,ZydisDecodedInstruction *instruction)

{
  ZyanU8 ZVar1;
  undefined2 uVar2;
  ZydisMachineMode ZVar3;
  ZydisInstructionEncoding ZVar4;
  ZydisMnemonic ZVar5;
  ushort *puVar6;
  ulong uVar7;
  ZyanUSize ZVar8;
  byte *pbVar9;
  ZydisDecoder *pZVar10;
  uint3 uVar11;
  bool bVar12;
  ulong *puVar13;
  undefined8 *puVar14;
  ZyanU8 ZVar15;
  ZyanBool ZVar16;
  short sVar17;
  ZyanU16 ZVar18;
  ushort uVar19;
  ZyanStatus status_047620348;
  ZydisOpcodeMap ZVar20;
  ZyanStatus ZVar21;
  ZydisInstructionCategory ZVar22;
  ZydisMaskMode ZVar23;
  ZydisDecoderTreeNode *pZVar24;
  ZydisDecoderTreeNode *node;
  ZydisDecoderTreeNode *pZVar25;
  ulong uVar26;
  sbyte sVar27;
  ZyanU8 size;
  byte bVar28;
  byte bVar29;
  ZydisMaskMode ZVar30;
  ZydisBranchType ZVar31;
  int iVar32;
  undefined1 *puVar33;
  undefined2 *puVar34;
  ZyanU8 *pZVar35;
  byte bVar36;
  uint uVar37;
  uint uVar38;
  ZydisBroadcastMode ZVar39;
  ulong uVar40;
  long lVar41;
  undefined3 *puVar42;
  byte bVar43;
  char cVar44;
  byte bVar45;
  char cVar46;
  byte bVar47;
  byte bVar48;
  ZydisDecoderContext *pZVar49;
  bool bVar50;
  bool bVar51;
  ZyanU16 index;
  ZyanU8 prefix_bytes [4];
  ZydisInstructionDefinitionLEGACY *def;
  ZydisDefinitionAccessedFlags *flags;
  ZydisInstructionEncodingInfo *info;
  ZyanU16 local_ac;
  char local_aa;
  ZyanBool local_a9;
  undefined8 local_a8;
  uint local_9c;
  byte local_96;
  byte local_95;
  undefined4 local_94;
  ZyanU8 *local_90;
  ZyanU8 *local_88;
  ZyanU8 *local_80;
  uint local_74;
  ulong local_70;
  ulong local_68;
  ZydisDecoderContext *local_60;
  undefined4 local_54;
  ZydisMnemonic *local_50;
  ulong local_48;
  ZydisDefinitionAccessedFlags *local_40;
  ZydisInstructionEncodingInfo *local_38;
  
  if (state == (ZydisDecoderState *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                  ,0x1243,
                  "ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *, ZydisDecodedInstruction *)"
                 );
  }
  local_90 = &(instruction->raw).evex.mmm;
  local_80 = &(instruction->raw).mvex.mmmm;
  local_88 = &(instruction->raw).vex.m_mmmm;
  pZVar25 = (ZydisDecoderTreeNode *)0x0;
  node = &zydis_decoder_tree_root;
LAB_00108101:
  do {
    pZVar24 = pZVar25;
    local_ac = 0;
    switch(node->type) {
    case '\0':
      if (pZVar24 == (ZydisDecoderTreeNode *)0x0) {
        return 0x80200001;
      }
      ZVar15 = (state->prefixes).mandatory_candidate;
      if (ZVar15 != '\0') {
        bVar43 = (state->prefixes).offset_mandatory;
        (instruction->raw).prefixes[bVar43].type = ZYDIS_PREFIX_TYPE_IGNORED;
        if (ZVar15 == 'f') {
          if ((state->prefixes).offset_osz_override == bVar43) {
            (instruction->raw).prefixes[bVar43].type = ZYDIS_PREFIX_TYPE_EFFECTIVE;
          }
          instruction->attributes = instruction->attributes | 0x80000000000;
        }
      }
      pZVar25 = (ZydisDecoderTreeNode *)0x0;
      node = pZVar24;
      goto LAB_00108101;
    case '\x01':
      if (instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_LEGACY) {
LAB_00108458:
        ZVar18 = 0;
      }
      else {
        if (instruction->encoding != ZYDIS_INSTRUCTION_ENCODING_XOP) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xddf,
                        "ZyanStatus ZydisNodeHandlerXOP(const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        if ((instruction->attributes & 8) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 3)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xddb,
                        "ZyanStatus ZydisNodeHandlerXOP(const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        bVar43 = (instruction->raw).xop.pp;
        ZVar18 = ((ushort)(instruction->raw).xop.m_mmmm + (ushort)bVar43 + (ushort)bVar43 * 2) - 7;
      }
      break;
    case '\x02':
      if (instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_LEGACY) goto LAB_00108458;
      if (instruction->encoding != ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xdf3,
                      "ZyanStatus ZydisNodeHandlerVEX(const ZydisDecodedInstruction *, ZyanU16 *)");
      }
      if ((instruction->attributes & 0x10) == 0) {
        __assert_fail("instruction->attributes & (1ULL << 4)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xdef,
                      "ZyanStatus ZydisNodeHandlerVEX(const ZydisDecodedInstruction *, ZyanU16 *)");
      }
      ZVar18 = (ushort)(instruction->raw).vex.m_mmmm + (ushort)(instruction->raw).vex.pp * 4 + 1;
      break;
    case '\x03':
      ZVar4 = instruction->encoding;
      if (ZVar4 == ZYDIS_INSTRUCTION_ENCODING_LEGACY) goto LAB_00108458;
      if (ZVar4 == ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE) {
        if ((instruction->attributes & 0x40) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 6)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xe07,
                        "ZyanStatus ZydisNodeHandlerEMVEX(const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        sVar17 = 0x21;
        sVar27 = 2;
        lVar41 = 0x11a;
        pZVar35 = local_80;
      }
      else {
        if (ZVar4 != ZYDIS_INSTRUCTION_ENCODING_EVEX) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xe0b,
                        "ZyanStatus ZydisNodeHandlerEMVEX(const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        if ((instruction->attributes & 0x20) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 5)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xe03,
                        "ZyanStatus ZydisNodeHandlerEMVEX(const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        sVar17 = 1;
        sVar27 = 3;
        lVar41 = 0x10b;
        pZVar35 = local_90;
      }
      ZVar18 = sVar17 + (ushort)*pZVar35 +
               ((ushort)*(byte *)((long)((instruction->raw).prefixes + -0xf) + 4 + lVar41) << sVar27
               );
      break;
    case '\x04':
      if (instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_3DNOW) {
        local_ac = 0xc;
        ZVar18 = local_ac;
      }
      else {
        if (instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_LEGACY) {
          bVar43 = instruction->length;
          if (0xe < bVar43) {
            return 0x80200002;
          }
          if (state->buffer_len == 0) {
            return 0x80200000;
          }
          pbVar9 = state->buffer;
          state->buffer = pbVar9 + 1;
          bVar28 = *pbVar9;
          instruction->opcode = bVar28;
          ZVar15 = bVar43 + 1;
          instruction->length = ZVar15;
          uVar40 = state->buffer_len;
          uVar26 = uVar40 - 1;
          state->buffer_len = uVar26;
          ZVar20 = instruction->opcode_map;
          if (ZYDIS_OPCODE_MAP_MAX_VALUE < ZVar20) {
LAB_0010a85f:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0xed0,
                          "ZyanStatus ZydisNodeHandlerOpcode(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                         );
          }
          if ((0xe0cU >> (ZVar20 & 0x1f) & 1) == 0) {
            if (ZVar20 == ZYDIS_OPCODE_MAP_DEFAULT) {
              if (bVar28 < 0xc4) {
                if (bVar28 == 0xf) {
                  instruction->opcode_map = ZYDIS_OPCODE_MAP_0F;
                }
                else {
                  if (bVar28 == 0x62) goto LAB_001088ca;
                  if (bVar28 == 0x8f) {
                    if (bVar43 == 0xe) {
                      return 0x80200002;
                    }
                    if (uVar26 == 0) {
                      return 0x80200000;
                    }
                    pbVar9 = state->buffer;
                    if ((*pbVar9 & 0x18) != 0) {
                      if ((instruction->attributes & 4) != 0) {
                        return 0x80200006;
                      }
                      if ((state->prefixes).has_lock != '\0') {
                        return 0x80200004;
                      }
                      if ((state->prefixes).mandatory_candidate != '\0') {
                        return 0x80200005;
                      }
                      (instruction->raw).xop.offset = bVar43;
                      local_a8._0_1_ = 0x8f;
                      if (ZVar15 == '\x0e') {
                        return 0x80200002;
                      }
                      if (uVar26 == 1) {
                        return 0x80200000;
                      }
                      instruction->length = bVar43 + 3;
                      local_a8._1_1_ = (byte)*(undefined2 *)pbVar9;
                      local_a8._2_1_ = (undefined1)((ushort)*(undefined2 *)pbVar9 >> 8);
                      state->buffer = pbVar9 + 2;
                      state->buffer_len = uVar40 - 3;
                      instruction->encoding = ZYDIS_INSTRUCTION_ENCODING_XOP;
                      ZVar21 = ZydisDecodeXOP(state->context,instruction,(ZyanU8 *)&local_a8);
                      if ((int)ZVar21 < 0) {
                        return ZVar21;
                      }
                      ZVar20 = (instruction->raw).xop.m_mmmm + ZYDIS_OPCODE_MAP_0F;
                      goto LAB_001089fa;
                    }
                  }
                }
              }
              else if (bVar28 - 0xc4 < 2) {
LAB_001088ca:
                if (bVar43 == 0xe) {
                  return 0x80200002;
                }
                if (uVar26 == 0) {
                  return 0x80200000;
                }
                puVar6 = (ushort *)state->buffer;
                if ((0xbf < (byte)*puVar6) ||
                   (instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_64)) {
                  uVar7 = instruction->attributes;
                  if ((uVar7 & 4) != 0) {
                    return 0x80200006;
                  }
                  if ((state->prefixes).has_lock != '\0') {
                    return 0x80200004;
                  }
                  if ((state->prefixes).mandatory_candidate != '\0') {
                    return 0x80200005;
                  }
                  local_a8._1_1_ = 0;
                  local_a8._2_1_ = 0;
                  local_a8._3_1_ = 0;
                  local_a8._0_1_ = bVar28;
                  if (bVar28 == 0x62) {
                    if ((uVar7 & 0x20) != 0) {
                      __assert_fail("!(instruction->attributes & (1ULL << 5))",
                                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                                    ,0xe4c,
                                    "ZyanStatus ZydisNodeHandlerOpcode(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                                   );
                    }
                    if ((uVar7 & 0x40) != 0) {
                      __assert_fail("!(instruction->attributes & (1ULL << 6))",
                                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                                    ,0xe4d,
                                    "ZyanStatus ZydisNodeHandlerOpcode(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                                   );
                    }
                    if (0xb < bVar43) {
                      return 0x80200002;
                    }
                    if (uVar26 < 3) {
                      return 0x80200000;
                    }
                    instruction->length = bVar43 + 4;
                    local_a8._3_1_ = (byte)puVar6[1];
                    uVar19 = *puVar6;
                    local_a8._1_1_ = (byte)uVar19;
                    local_a8._2_1_ = (undefined1)(uVar19 >> 8);
                    state->buffer = (byte *)((long)puVar6 + 3);
                    state->buffer_len = uVar40 - 4;
                    if ((uVar19 & 0x400) == 0) {
                      (instruction->raw).mvex.offset = bVar43;
                      if (state->decoder->machine_mode != ZYDIS_MACHINE_MODE_LONG_64) {
                        return 0x80200001;
                      }
                      instruction->encoding = ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE;
                      ZVar21 = ZydisDecodeMVEX(state->context,instruction,(ZyanU8 *)&local_a8);
                      pZVar35 = local_80;
                    }
                    else {
                      (instruction->raw).evex.offset = bVar43;
                      instruction->encoding = ZYDIS_INSTRUCTION_ENCODING_EVEX;
                      ZVar21 = ZydisDecodeEVEX(state->context,instruction,(ZyanU8 *)&local_a8);
                      pZVar35 = local_90;
                    }
                  }
                  else {
                    if (bVar28 == 0xc5) {
                      (instruction->raw).vex.offset = bVar43;
                      if ((uVar7 & 0x10) != 0) {
                        __assert_fail("!(instruction->attributes & (1ULL << 4))",
                                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                                      ,0xe46,
                                      "ZyanStatus ZydisNodeHandlerOpcode(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                                     );
                      }
                      state->buffer = (byte *)((long)puVar6 + 1);
                      local_a8._1_1_ = (byte)*puVar6;
                      instruction->length = bVar43 + 2;
                    }
                    else {
                      if (bVar28 != 0xc4) {
                        __assert_fail("0",
                                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                                      ,0xe54,
                                      "ZyanStatus ZydisNodeHandlerOpcode(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                                     );
                      }
                      (instruction->raw).vex.offset = bVar43;
                      if ((uVar7 & 0x10) != 0) {
                        __assert_fail("!(instruction->attributes & (1ULL << 4))",
                                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                                      ,0xe40,
                                      "ZyanStatus ZydisNodeHandlerOpcode(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                                     );
                      }
                      if (ZVar15 == '\x0e') {
                        return 0x80200002;
                      }
                      if (uVar26 == 1) {
                        return 0x80200000;
                      }
                      instruction->length = bVar43 + 3;
                      local_a8._1_1_ = (byte)*puVar6;
                      local_a8._2_1_ = (undefined1)(*puVar6 >> 8);
                      state->buffer = (ZyanU8 *)(puVar6 + 1);
                      uVar40 = uVar26;
                    }
                    state->buffer_len = uVar40 - 2;
                    instruction->encoding = ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS;
                    ZVar21 = ZydisDecodeVEX(state->context,instruction,(ZyanU8 *)&local_a8);
                    pZVar35 = local_88;
                  }
                  if ((int)ZVar21 < 0) {
                    return ZVar21;
                  }
                  ZVar20 = (ZydisOpcodeMap)*pZVar35;
LAB_001089fa:
                  instruction->opcode_map = ZVar20;
                }
              }
            }
            else {
              if (ZVar20 != ZYDIS_OPCODE_MAP_0F) goto LAB_0010a85f;
              if (bVar28 == 0x3a) {
                instruction->opcode_map = ZYDIS_OPCODE_MAP_0F3A;
              }
              else if (bVar28 == 0x38) {
                instruction->opcode_map = ZYDIS_OPCODE_MAP_0F38;
              }
              else if (bVar28 == 0xf) {
                if ((state->prefixes).has_lock != '\0') {
                  return 0x80200004;
                }
                instruction->encoding = ZYDIS_INSTRUCTION_ENCODING_3DNOW;
                instruction->opcode_map = ZYDIS_OPCODE_MAP_0F0F;
              }
            }
          }
        }
        else {
          bVar43 = instruction->length;
          if (0xe < bVar43) {
            return 0x80200002;
          }
          if (state->buffer_len == 0) {
            return 0x80200000;
          }
          pZVar35 = state->buffer;
          state->buffer = pZVar35 + 1;
          instruction->opcode = *pZVar35;
          instruction->length = bVar43 + 1;
          state->buffer_len = state->buffer_len - 1;
        }
        ZVar18 = (ushort)instruction->opcode;
      }
      break;
    case '\x05':
      if (5 < (ulong)instruction->machine_mode) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xef5,
                      "ZyanStatus ZydisNodeHandlerMode(const ZydisDecodedInstruction *, ZyanU16 *)")
        ;
      }
      ZVar18 = *(ZyanU16 *)(&DAT_0010f854 + (ulong)instruction->machine_mode * 2);
      break;
    case '\x06':
      bVar50 = instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_64;
      goto LAB_001085cf;
    case '\a':
      ZVar21 = ZydisNodeHandlerModrmMod(state,instruction,&local_ac);
      ZVar18 = local_ac;
      if ((int)ZVar21 < 0) {
        return ZVar21;
      }
      break;
    case '\b':
      ZVar21 = ZydisNodeHandlerModrmMod(state,instruction,&local_ac);
      if ((int)ZVar21 < 0) {
        return ZVar21;
      }
      bVar50 = local_ac == 3;
      goto LAB_001085cf;
    case '\t':
      if ((instruction->raw).modrm.offset == '\0') {
        bVar43 = instruction->length;
        (instruction->raw).modrm.offset = bVar43;
        if (0xe < bVar43) {
          return 0x80200002;
        }
        ZVar8 = state->buffer_len;
        if (ZVar8 == 0) {
          return 0x80200000;
        }
        pZVar35 = state->buffer;
        state->buffer = pZVar35 + 1;
        ZVar15 = *pZVar35;
        instruction->length = bVar43 + 1;
        state->buffer_len = ZVar8 - 1;
        ZydisDecodeModRM(instruction,ZVar15);
      }
      ZVar18 = (ushort)(instruction->raw).modrm.reg;
      break;
    case '\n':
      if ((instruction->raw).modrm.offset == '\0') {
        bVar43 = instruction->length;
        (instruction->raw).modrm.offset = bVar43;
        if (0xe < bVar43) {
          return 0x80200002;
        }
        ZVar8 = state->buffer_len;
        if (ZVar8 == 0) {
          return 0x80200000;
        }
        pZVar35 = state->buffer;
        state->buffer = pZVar35 + 1;
        ZVar15 = *pZVar35;
        instruction->length = bVar43 + 1;
        state->buffer_len = ZVar8 - 1;
        ZydisDecodeModRM(instruction,ZVar15);
      }
      ZVar18 = (ushort)(instruction->raw).modrm.rm;
      break;
    case '\v':
      bVar50 = (state->prefixes).group1 == '\0';
LAB_001085cf:
      ZVar18 = (ushort)!bVar50;
      break;
    case '\f':
      ZVar15 = (state->prefixes).mandatory_candidate;
      if (ZVar15 == 0xf3) {
        (instruction->raw).prefixes[(state->prefixes).offset_mandatory].type =
             ZYDIS_PREFIX_TYPE_MANDATORY;
        local_ac = 3;
      }
      else if (ZVar15 == 0xf2) {
        (instruction->raw).prefixes[(state->prefixes).offset_mandatory].type =
             ZYDIS_PREFIX_TYPE_MANDATORY;
        local_ac = 4;
      }
      else {
        local_ac = 1;
        if (ZVar15 == 'f') {
          (instruction->raw).prefixes[(state->prefixes).offset_mandatory].type =
               ZYDIS_PREFIX_TYPE_MANDATORY;
          pbVar9 = (byte *)((long)&instruction->attributes + 5);
          *pbVar9 = *pbVar9 & 0xf7;
          local_ac = 2;
        }
      }
      pZVar24 = ZydisDecoderTreeGetChildNode(node,0);
      ZVar18 = local_ac;
      break;
    case '\r':
      ZVar3 = instruction->machine_mode;
      if ((ZVar3 != ZYDIS_MACHINE_MODE_LONG_64) ||
         (ZVar18 = 2, (state->context->vector_unified).W == '\0')) {
        uVar26 = instruction->attributes;
        if ((uVar26 & 0x80000000000) != 0) {
          (instruction->raw).prefixes[(state->prefixes).offset_osz_override].type =
               ZYDIS_PREFIX_TYPE_EFFECTIVE;
        }
        if (ZYDIS_MACHINE_MODE_MAX_VALUE < ZVar3) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xf83,
                        "ZyanStatus ZydisNodeHandlerOperandSize(const ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        if ((0xbU >> (ZVar3 & 0x1f) & 1) == 0) {
          uVar19 = (ushort)(uint)(uVar26 >> 0x2b);
          goto LAB_0010864d;
        }
        ZVar18 = (ushort)((uVar26 & 0x80000000000) == 0);
      }
      break;
    case '\x0e':
      ZVar3 = instruction->machine_mode;
      if (ZYDIS_MACHINE_MODE_MAX_VALUE < ZVar3) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xfa3,
                      "ZyanStatus ZydisNodeHandlerAddressSize(ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      if ((0x34U >> (ZVar3 & 0x1f) & 1) == 0) {
        if ((10U >> (ZVar3 & 0x1f) & 1) == 0) {
          ZVar18 = ((instruction->attributes & 0x100000000000) == 0) + 1;
        }
        else {
          ZVar18 = (ushort)((instruction->attributes & 0x100000000000) == 0);
        }
      }
      else {
        uVar19 = (ushort)(uint)(instruction->attributes >> 0x2c);
LAB_0010864d:
        ZVar18 = uVar19 & 1;
      }
      break;
    case '\x0f':
      if (state->context == (ZydisDecoderContext *)0x0) {
        __assert_fail("context",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xfac,
                      "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      switch(instruction->encoding) {
      case ZYDIS_INSTRUCTION_ENCODING_XOP:
        if ((instruction->attributes & 8) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 3)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xfb3,
                        "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS:
        if ((instruction->attributes & 0x10) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 4)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xfb6,
                        "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_EVEX:
        if ((instruction->attributes & 0x20) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 5)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xfb9,
                        "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE:
        if ((instruction->attributes & 0x40) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 6)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xfbc,
                        "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xfbf,
                      "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      ZVar18 = (ZyanU16)(state->context->vector_unified).LL;
      if (ZVar18 == 3) {
        return 0x80200001;
      }
      break;
    case '\x10':
      if (state->context == (ZydisDecoderContext *)0x0) {
        __assert_fail("context",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xfcd,
                      "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      switch(instruction->encoding) {
      case ZYDIS_INSTRUCTION_ENCODING_LEGACY:
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xfe3,
                      "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      case ZYDIS_INSTRUCTION_ENCODING_XOP:
        if ((instruction->attributes & 8) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 3)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xfd7,
                        "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS:
        if ((instruction->attributes & 0x10) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 4)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xfda,
                        "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_EVEX:
        if ((instruction->attributes & 0x20) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 5)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xfdd,
                        "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE:
        if ((instruction->attributes & 0x40) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 6)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xfe0,
                        "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
      }
      ZVar18 = (ushort)(state->context->vector_unified).W;
      break;
    case '\x11':
      if (state->context == (ZydisDecoderContext *)0x0) {
        __assert_fail("context",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xfec,
                      "ZyanStatus ZydisNodeHandlerRexB(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      switch(instruction->encoding) {
      case ZYDIS_INSTRUCTION_ENCODING_LEGACY:
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0x1002,
                      "ZyanStatus ZydisNodeHandlerRexB(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      case ZYDIS_INSTRUCTION_ENCODING_XOP:
        if ((instruction->attributes & 8) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 3)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xff6,
                        "ZyanStatus ZydisNodeHandlerRexB(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS:
        if ((instruction->attributes & 0x10) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 4)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xff9,
                        "ZyanStatus ZydisNodeHandlerRexB(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_EVEX:
        if ((instruction->attributes & 0x20) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 5)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xffc,
                        "ZyanStatus ZydisNodeHandlerRexB(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE:
        if ((instruction->attributes & 0x40) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 6)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0xfff,
                        "ZyanStatus ZydisNodeHandlerRexB(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
      }
      ZVar18 = (ushort)(state->context->vector_unified).B;
      break;
    case '\x12':
      if (instruction->encoding != ZYDIS_INSTRUCTION_ENCODING_EVEX) {
        __assert_fail("instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_EVEX",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0x100e,
                      "ZyanStatus ZydisNodeHandlerEvexB(const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      if ((instruction->attributes & 0x20) == 0) {
        __assert_fail("instruction->attributes & (1ULL << 5)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0x100f,
                      "ZyanStatus ZydisNodeHandlerEvexB(const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      ZVar18 = (ushort)(instruction->raw).evex.b;
      break;
    case '\x13':
      if (instruction->encoding != ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE) {
        __assert_fail("instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_MVEX",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0x101b,
                      "ZyanStatus ZydisNodeHandlerMvexE(const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      if ((instruction->attributes & 0x40) == 0) {
        __assert_fail("instruction->attributes & (1ULL << 6)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0x101c,
                      "ZyanStatus ZydisNodeHandlerMvexE(const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      ZVar18 = (ushort)(instruction->raw).mvex.E;
      break;
    case '\x14':
      bVar50 = state->decoder->decoder_mode[1] == '\0';
      goto LAB_00108616;
    case '\x15':
      bVar50 = state->decoder->decoder_mode[2] == '\0';
      goto LAB_00108616;
    case '\x16':
      bVar50 = state->decoder->decoder_mode[3] == '\0';
      goto LAB_00108616;
    case '\x17':
      bVar50 = state->decoder->decoder_mode[4] == '\0';
      goto LAB_00108616;
    case '\x18':
      bVar50 = state->decoder->decoder_mode[5] == '\0';
      goto LAB_00108616;
    case '\x19':
      bVar50 = state->decoder->decoder_mode[6] == '\0';
      goto LAB_00108616;
    case '\x1a':
      bVar50 = state->decoder->decoder_mode[7] == '\0';
      goto LAB_00108616;
    case '\x1b':
      bVar50 = state->decoder->decoder_mode[8] == '\0';
LAB_00108616:
      ZVar18 = (ushort)!bVar50;
      break;
    default:
      goto switchD_0010811e_default;
    }
    local_ac = ZVar18;
    node = ZydisDecoderTreeGetChildNode(node,local_ac);
    pZVar25 = pZVar24;
  } while( true );
switchD_00109a26_caseD_4:
  if (0xbf < bVar47) {
    __assert_fail("def->element_size < (sizeof(scales) / sizeof((scales)[0]))",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                  ,0x9ec,
                  "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  ZVar15 = *(ZyanU8 *)((long)&ZydisSetAVXInformation_scales_113 + (ulong)(bVar47 >> 5));
  goto LAB_0010a71a;
switchD_0010811e_default:
  if (-1 < (char)node->type) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                  ,0x1311,
                  "ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *, ZydisDecodedInstruction *)"
                 );
  }
  ZydisGetInstructionDefinition
            (instruction->encoding,node->value,(ZydisInstructionDefinition **)&local_a8);
  pZVar49 = state->context;
  if (pZVar49 == (ZydisDecoderContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                  ,0xd15,
                  "void ZydisSetEffectiveOperandWidth(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  puVar13 = (ulong *)CONCAT44(local_a8._4_4_,
                              CONCAT13(local_a8._3_1_,
                                       CONCAT12(local_a8._2_1_,
                                                CONCAT11(local_a8._1_1_,(byte)local_a8))));
  if (puVar13 == (ulong *)0x0) {
    __assert_fail("definition",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                  ,0xd17,
                  "void ZydisSetEffectiveOperandWidth(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  uVar26 = instruction->attributes;
  bVar43 = (byte)(uVar26 >> 0x2b) & 1;
  ZVar3 = instruction->machine_mode;
  if (ZVar3 == ZYDIS_MACHINE_MODE_LONG_64) {
    bVar43 = bVar43 | (pZVar49->vector_unified).W * '\x02' & 2 | 4;
  }
  else if ((ZVar3 == ZYDIS_MACHINE_MODE_LEGACY_32) || (ZVar3 == ZYDIS_MACHINE_MODE_LONG_COMPAT_32))
  {
    bVar43 = bVar43 | 2;
  }
  bVar43 = ZydisSetEffectiveOperandWidth_operand_size_map
           [(ulong)bVar43 + (ulong)((uint)(*puVar13 >> 0x21) & 7) * 8];
  instruction->operand_width = bVar43;
  pZVar49->eosz_index = bVar43 >> 5;
  if ((*puVar13 & 0xe00000000) == 0x200000000) {
    instruction->operand_width = '\b';
  }
  bVar43 = (byte)(uVar26 >> 0x2c) & 1;
  if (ZVar3 == ZYDIS_MACHINE_MODE_LONG_64) {
    bVar43 = bVar43 | 4;
  }
  else if ((ZVar3 == ZYDIS_MACHINE_MODE_LEGACY_32) || (ZVar3 == ZYDIS_MACHINE_MODE_LONG_COMPAT_32))
  {
    bVar43 = bVar43 | 2;
  }
  uVar26 = (ulong)((uint)(*puVar13 >> 0x24) & 3);
  if (uVar26 == 3) {
    __assert_fail("definition->address_size_map < (sizeof(address_size_map) / sizeof((address_size_map)[0]))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                  ,0xdc7,
                  "void ZydisSetEffectiveAddressWidth(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  bVar43 = ZydisSetEffectiveAddressWidth_address_size_map[(ulong)bVar43 + uVar26 * 8];
  instruction->address_width = bVar43;
  pZVar49->easz_index = bVar43 >> 5;
  ZydisGetInstructionEncodingInfo(node,&local_38);
  if (local_38 == (ZydisInstructionEncodingInfo *)0x0) {
    __assert_fail("info",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                  ,0xc90,
                  "ZyanStatus ZydisDecodeOptionalInstructionParts(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionEncodingInfo *)"
                 );
  }
  pZVar49 = state->context;
  bVar43 = local_38->flags;
  if ((bVar43 & 1) != 0) {
    if ((instruction->raw).modrm.offset == '\0') {
      bVar43 = instruction->length;
      (instruction->raw).modrm.offset = bVar43;
      if (0xe < bVar43) {
        return 0x80200002;
      }
      ZVar8 = state->buffer_len;
      if (ZVar8 == 0) {
        return 0x80200000;
      }
      pZVar35 = state->buffer;
      state->buffer = pZVar35 + 1;
      ZVar15 = *pZVar35;
      instruction->length = bVar43 + 1;
      state->buffer_len = ZVar8 - 1;
      ZydisDecodeModRM(instruction,ZVar15);
      bVar43 = local_38->flags;
    }
    if ((bVar43 & 0x10) == 0) {
      ZVar15 = instruction->address_width;
      if ((ZVar15 == '@') || (ZVar15 == ' ')) {
        ZVar15 = (instruction->raw).modrm.mod;
        bVar28 = 1;
        if (ZVar15 == '\x03') goto LAB_00108e00;
        ZVar1 = (instruction->raw).modrm.rm;
        if (ZVar15 == '\x02') {
          size = ' ';
LAB_00108cfc:
          bVar50 = false;
        }
        else {
          if (ZVar15 == '\x01') {
            size = '\b';
            goto LAB_00108cfc;
          }
          if (ZVar15 != '\0') {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0xcd2,
                          "ZyanStatus ZydisDecodeOptionalInstructionParts(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionEncodingInfo *)"
                         );
          }
          if (ZVar1 == '\x05') {
            size = ' ';
            if (instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_64) {
              *(byte *)&instruction->attributes = (byte)instruction->attributes | 0x80;
            }
            goto LAB_00108dd4;
          }
          bVar50 = true;
          size = '\0';
        }
        if (ZVar1 == '\x04') {
          bVar28 = instruction->length;
          (instruction->raw).sib.offset = bVar28;
          if (0xe < bVar28) {
            return 0x80200002;
          }
          ZVar8 = state->buffer_len;
          if (ZVar8 == 0) {
            return 0x80200000;
          }
          pbVar9 = state->buffer;
          state->buffer = pbVar9 + 1;
          bVar29 = *pbVar9;
          instruction->length = bVar28 + 1;
          state->buffer_len = ZVar8 - 1;
          uVar26 = instruction->attributes;
          if ((uVar26 & 1) == 0) {
            __assert_fail("instruction->attributes & (1ULL << 0)",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0x2c0,"void ZydisDecodeSIB(ZydisDecodedInstruction *, ZyanU8)");
          }
          if ((uVar26 & 2) != 0) {
            __assert_fail("!(instruction->attributes & (1ULL << 1))",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0x2c2,"void ZydisDecodeSIB(ZydisDecodedInstruction *, ZyanU8)");
          }
          instruction->attributes = uVar26 | 2;
          (instruction->raw).sib.scale = bVar29 >> 6;
          (instruction->raw).sib.index = bVar29 >> 3 & 7;
          (instruction->raw).sib.base = bVar29 & 7;
          if ((bVar29 & 7) == 5) {
            size = ' ';
            if (ZVar15 == '\x01') {
              size = '\b';
            }
            goto LAB_00108dd4;
          }
        }
        if (!bVar50) goto LAB_00108dd4;
        goto LAB_00108ded;
      }
      if (ZVar15 != '\x10') {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xcd6,
                      "ZyanStatus ZydisDecodeOptionalInstructionParts(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionEncodingInfo *)"
                     );
      }
      switch((instruction->raw).modrm.mod) {
      case '\0':
        size = '\x10';
        if ((instruction->raw).modrm.rm == '\x06') break;
        goto LAB_00108df8;
      case '\x01':
        size = '\b';
        break;
      case '\x02':
        size = '\x10';
        break;
      case '\x03':
        bVar28 = 1;
        goto LAB_00108e00;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xcb6,
                      "ZyanStatus ZydisDecodeOptionalInstructionParts(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionEncodingInfo *)"
                     );
      }
LAB_00108dd4:
      ZVar21 = ZydisReadDisplacement(state,instruction,size);
      if ((int)ZVar21 < 0) {
        return ZVar21;
      }
      bVar43 = local_38->flags;
    }
LAB_00108ded:
    bVar28 = 1;
    if ((instruction->raw).modrm.mod != '\x03') {
LAB_00108df8:
      bVar28 = bVar43 >> 4 & 1;
    }
LAB_00108e00:
    (pZVar49->reg_info).is_mod_reg = bVar28;
  }
  if ((bVar43 & 2) != 0) {
    ZVar21 = ZydisReadDisplacement(state,instruction,(local_38->disp).size[pZVar49->easz_index]);
    if ((int)ZVar21 < 0) {
      return ZVar21;
    }
    bVar43 = local_38->flags;
  }
  if ((bVar43 & 4) != 0) {
    ZVar16 = local_38->imm[0].is_relative;
    if (ZVar16 != '\0') {
      *(byte *)&instruction->attributes = (byte)instruction->attributes | 0x80;
    }
    ZVar21 = ZydisReadImmediate(state,instruction,'\0',local_38->imm[0].size[pZVar49->eosz_index],
                                local_38->imm[0].is_signed,ZVar16);
    if ((int)ZVar21 < 0) {
      return ZVar21;
    }
    bVar43 = local_38->flags;
  }
  if ((bVar43 & 8) != 0) {
    if ((bVar43 & 2) != 0) {
      __assert_fail("!(info->flags & 0x02)",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xd00,
                    "ZyanStatus ZydisDecodeOptionalInstructionParts(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionEncodingInfo *)"
                   );
    }
    ZVar21 = ZydisReadImmediate(state,instruction,'\x01',local_38->imm[1].size[pZVar49->eosz_index],
                                local_38->imm[1].is_signed,local_38->imm[1].is_relative);
    if ((int)ZVar21 < 0) {
      return ZVar21;
    }
  }
  local_50 = (ZydisMnemonic *)
             CONCAT44(local_a8._4_4_,
                      CONCAT13(local_a8._3_1_,
                               CONCAT12(local_a8._2_1_,CONCAT11(local_a8._1_1_,(byte)local_a8))));
  if (local_50 == (ZydisMnemonic *)0x0) {
    __assert_fail("definition",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                  ,0x10fe,
                  "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  ZVar4 = instruction->encoding;
  uVar26 = (ulong)ZVar4;
  if (5 < uVar26) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                  ,0x1199,
                  "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  ZVar5 = local_50[2];
  bVar50 = true;
  local_80 = (ZyanU8 *)uVar26;
  switch(uVar26) {
  case 0:
    if ((((ulong)*(undefined8 *)local_50 >> 0x2d & 1) != 0) &&
       (instruction->machine_mode == ZYDIS_MACHINE_MODE_MAX_VALUE)) {
      return 0x80200001;
    }
    if ((((ulong)*(undefined8 *)local_50 >> 0x2e & 1) != 0) &&
       (instruction->machine_mode - ZYDIS_MACHINE_MODE_LONG_COMPAT_32 < 2)) {
      return 0x80200001;
    }
    local_9c = 0;
    local_70 = 0;
    local_68 = 0;
    uVar26 = 0;
    if ((state->prefixes).has_lock != '\0' && -1 < (int)ZVar5) {
      return 0x80200004;
    }
    break;
  case 1:
    local_9c = 0;
    local_70 = 0;
    local_68 = 0;
    uVar26 = 0;
    break;
  case 2:
    uVar26 = (ulong)CONCAT41((uint)((uint5)*(undefined5 *)(local_50 + 2) >> 0x26),
                             (char)((uint5)*(undefined5 *)(local_50 + 2) >> 0x1e)) &
             0xffffffffffffff1f;
    local_9c = 0;
    local_70 = 0;
    local_68 = 0;
    break;
  case 3:
    uVar26 = (ulong)((uint6)*(undefined6 *)(local_50 + 2) >> 0x1e);
    uVar19 = CONCAT11((char)((ushort)(short)local_50[3] >> 8),(byte)(short)local_50[3] >> 3);
    bVar50 = (*(undefined6 *)(local_50 + 2) & 0x2000000000) == ZYDIS_MNEMONIC_INVALID;
    local_9c = 0;
    goto LAB_001090c3;
  case 4:
    uVar26 = (ulong)CONCAT41((uint)((uint5)*(undefined5 *)(local_50 + 2) >> 0x26),
                             (char)((uint5)*(undefined5 *)(local_50 + 2) >> 0x1e)) &
             0xffffffffffffff1f;
    local_68 = (ulong)((byte)(char)local_50[3] >> 3) & 0xffffffffffffff01;
    local_70 = (ulong)((byte)(char)local_50[3] >> 4 & 1);
    local_9c = *(ushort *)((long)local_50 + 0xe) >> 2 & 3;
    if (((instruction->raw).evex.z != '\0') && ((*(ushort *)((long)local_50 + 0xe) & 0x10) == 0)) {
      return 0x8020000a;
    }
    break;
  case 5:
    uVar2 = (undefined2)local_50[3];
    uVar26 = (ulong)((ushort)uVar2 >> 6 & 0x1f);
    if (0x19 < uVar26) {
      __assert_fail("def->functionality < (sizeof(lookup) / sizeof((lookup)[0]))",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x118d,
                    "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    uVar40 = (ulong)(instruction->raw).mvex.SSS;
    if (7 < uVar40) {
      __assert_fail("instruction->raw.mvex.SSS < 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x118e,
                    "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (ZydisCheckErrorConditions_lookup[uVar40 + uVar26 * 8] == '\0') {
      return 0x80200001;
    }
    uVar11 = CONCAT12(*(byte *)((long)local_50 + 0xe),uVar2);
    uVar26 = (ulong)CONCAT31(uVar11 >> 6,(char)(CONCAT34(uVar11,local_50[2]) >> 0x1e));
    uVar19 = CONCAT11((char)((ushort)uVar2 >> 8),(byte)uVar2 >> 3);
    local_9c = (ushort)uVar2 >> 0xb & 3;
LAB_001090c3:
    local_68 = (ulong)uVar19 & 0xffffffffffffff01;
    uVar26 = uVar26 & 0xffffffffffffff1f;
    local_70 = 0;
  }
  bVar43 = (byte)(ZVar5 >> 0xd);
  local_95 = bVar43 & 0x1f;
  uVar37 = ZVar5 >> 0x12;
  pZVar49 = state->context;
  local_a9 = (pZVar49->reg_info).is_mod_reg;
  uVar38 = 0;
  local_74 = (uint)(bVar43 & 0xf);
  if ((ZVar5 >> 0xd & 0x1f) == 0) {
    local_74 = 0;
  }
  bVar43 = (byte)((ulong)uVar37 & 0xffffffffffffff1f);
  if (bVar43 == 0) {
LAB_00109140:
    local_94 = 0;
LAB_00109148:
    local_96 = (instruction->raw).modrm.rm;
  }
  else {
    if (local_a9 != '\0') {
      uVar38 = uVar37 & 0xffffff0f;
      local_94 = (undefined4)
                 CONCAT71((int7)(((ulong)uVar37 & 0xffffffffffffff1f) >> 8),0xf < bVar43);
      goto LAB_00109148;
    }
    uVar38 = uVar37 & 0xffffff07;
    if ((((uVar37 & 8) == 0) || (state->decoder->machine_mode != ZYDIS_MACHINE_MODE_LONG_64)) ||
       ((instruction->raw).modrm.mod != '\0')) goto LAB_00109140;
    local_96 = (instruction->raw).modrm.rm;
    if (local_96 == 5) {
      return 0x80200003;
    }
    local_94 = 0;
  }
  bVar51 = local_96 == 4;
  bVar12 = local_a9 == '\0';
  local_88 = (ZyanU8 *)CONCAT44(local_88._4_4_,uVar38);
  cVar44 = (char)uVar38;
  bVar43 = (instruction->raw).modrm.reg;
  bVar28 = (pZVar49->vector_unified).vvvv;
  local_90 = (ZyanU8 *)(ulong)local_74;
  if (instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_64) {
    bVar36 = (pZVar49->vector_unified).V2 << 4;
    bVar29 = bVar36;
    if (cVar44 != '\x04' || (!bVar51 || !bVar12)) {
      bVar29 = 0;
    }
    ZVar15 = (pZVar49->vector_unified).X;
    bVar47 = ZVar15 << 4;
    if (ZVar4 < ZYDIS_INSTRUCTION_ENCODING_EVEX) {
      bVar47 = 0;
    }
    bVar45 = (pZVar49->vector_unified).B << 3;
    if (local_a9 == '\0') {
      bVar48 = 0xff;
    }
    else {
      bVar48 = ZydisPopulateRegisterIds_mask_rm[(ulong)uVar38 & 0xff];
    }
    bVar48 = bVar48 & (local_96 | bVar45 | bVar47);
    bVar36 = bVar36 | bVar28;
    bVar45 = bVar45 | *(byte *)((long)(instruction->raw).imm + (ulong)(bVar51 && bVar12) * 4 + -0x16
                               );
    bVar29 = bVar29 | (instruction->raw).sib.index | ZVar15 << 3;
    bVar43 = ((pZVar49->vector_unified).R << 3 | (pZVar49->vector_unified).R2 << 4 | bVar43) &
             ZydisPopulateRegisterIds_mask_reg[(long)local_90];
    local_54 = 0;
    local_aa = bVar50;
    local_60 = pZVar49;
    local_48 = uVar26;
  }
  else {
    bVar36 = bVar28 & 7;
    bVar45 = *(byte *)((long)(instruction->raw).imm + (ulong)(bVar51 && bVar12) * 4 + -0x16);
    bVar29 = (instruction->raw).sib.index;
    bVar48 = local_96;
  }
  cVar46 = (char)uVar26;
  if (cVar46 == '\0') {
    if (bVar28 != 0) {
      return 0x80200003;
    }
    if ((cVar44 != '\x04' || (!bVar51 || !bVar12)) && ((pZVar49->vector_unified).V2 != '\0')) {
      return 0x80200003;
    }
  }
  bVar51 = instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_64;
  if ((byte)ZydisPopulateRegisterIds_available_regs[(long)local_90 + (ulong)bVar51 * 0xc] <= bVar43)
  {
    return 0x80200003;
  }
  if ((byte)ZydisPopulateRegisterIds_available_regs[(uVar26 & 0xff) + (ulong)bVar51 * 0xc] <= bVar36
     ) {
    return 0x80200003;
  }
  if ((local_a9 != '\0') &&
     ((byte)ZydisPopulateRegisterIds_available_regs[((ulong)uVar38 & 0xff) + (ulong)bVar51 * 0xc] <=
      bVar48)) {
    return 0x80200003;
  }
  bVar28 = 0xff;
  if ((char)local_74 == '\b') {
    bVar28 = bVar43;
  }
  bVar47 = bVar48;
  if (cVar44 != '\b') {
    bVar47 = bVar28;
  }
  if (local_a9 == '\0') {
    bVar47 = bVar28;
  }
  if (-1 < (char)bVar47) {
    if (0xf < bVar47) {
      __assert_fail("id_cr < (sizeof(lookup) / sizeof((lookup)[0]))",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x10dc,
                    "ZyanStatus ZydisPopulateRegisterIds(ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU8, ZyanU8, ZyanU8)"
                   );
    }
    if ((0xfee2UL >> ((ulong)bVar47 & 0x3f) & 1) != 0) {
      return 0x80200003;
    }
  }
  local_60 = (ZydisDecoderContext *)CONCAT44(local_60._4_4_,(uint)bVar43);
  bVar47 = (byte)-(uint)((char)local_74 == '\0') | bVar43;
  (pZVar49->reg_info).id_reg = bVar47;
  bVar48 = -(local_a9 == '\0') | -(cVar44 == '\0') | bVar48;
  (pZVar49->reg_info).id_rm = bVar48;
  bVar28 = -(cVar46 == '\0') | bVar36;
  (pZVar49->reg_info).id_ndsndd = bVar28;
  (pZVar49->reg_info).id_base = bVar45;
  (pZVar49->reg_info).id_index = bVar29;
  local_90 = (ZyanU8 *)(ulong)CONCAT31((int3)(-(uint)((char)local_74 == '\0') >> 8),bVar47);
  if (0xf < local_95 && bVar47 == 1) {
    return 0x80200003;
  }
  if (((byte)local_94 & bVar48 == 1) != 0) {
    return 0x80200003;
  }
  if ((char)local_68 != '\0') {
    if ((instruction->raw).modrm.mod == '\x03') {
      local_aa = bVar50;
      __assert_fail("instruction->raw.modrm.mod != 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x11d2,
                    "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (local_96 != 4) {
      local_aa = bVar50;
      __assert_fail("instruction->raw.modrm.rm == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x11d3,
                    "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    bVar45 = bVar47;
    if (ZVar4 == ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS) {
      if ((((char)local_74 != '\x04') || (cVar44 != '\x04')) || (cVar46 != '\x04')) {
        local_aa = bVar50;
        __assert_fail("(def_reg == ZYDIS_REGKIND_VR) && (def_rm == ZYDIS_MEMOP_TYPE_VSIB) && (def_ndsndd == ZYDIS_REGKIND_VR)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0x11dd,
                      "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
    }
    else {
      bVar36 = 0xf0;
      if ((ZVar4 & ~ZYDIS_INSTRUCTION_ENCODING_3DNOW) == ZYDIS_INSTRUCTION_ENCODING_EVEX) {
        if (((cVar46 != '\0') || ((local_74 & 0xb) != 0)) || (cVar44 != '\x04')) {
          local_aa = bVar50;
          __assert_fail("((def_reg == ZYDIS_REGKIND_INVALID) || (def_reg == ZYDIS_REGKIND_VR)) && (def_rm == ZYDIS_MEMOP_TYPE_VSIB) && (def_ndsndd == ZYDIS_REGKIND_INVALID)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                        ,0x11e7,
                        "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        bVar45 = bVar43;
        bVar36 = 0xf0;
        if ((char)local_74 == '\0') {
          bVar45 = 0xf1;
        }
      }
    }
    if (bVar45 == bVar29) {
      return 0x80200003;
    }
    if (bVar36 == bVar45) {
      return 0x80200003;
    }
    if (bVar36 == bVar29) {
      return 0x80200003;
    }
  }
  if ((char)local_70 != '\0') {
    if (1 < ZVar4 - ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS) {
      local_aa = bVar50;
      __assert_fail("(instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_EVEX) || (instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_VEX)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x11fd,
                    "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (bVar47 == bVar28) {
      return 0x80200003;
    }
    if (local_a9 != '\0' && bVar47 == bVar48) {
      return 0x80200003;
    }
  }
  if (bVar50 == false) {
    if (ZVar4 != ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS) {
      local_aa = bVar50;
      __assert_fail("instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_VEX",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x120d,
                    "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (local_a9 == '\0') {
      local_aa = bVar50;
      __assert_fail("is_reg",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x120e,
                    "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (bVar47 == bVar28) {
      return 0x80200003;
    }
    if (bVar28 == bVar48) {
      return 0x80200003;
    }
    if (bVar47 == bVar48) {
      return 0x80200003;
    }
  }
  if (1 < local_9c) {
    if (local_9c == 3) {
      if ((pZVar49->vector_unified).mask != '\0') {
        return 0x8020000a;
      }
    }
    else if ((pZVar49->vector_unified).mask == '\0') {
      return 0x8020000a;
    }
  }
  local_aa = bVar50;
  if (ZVar4 == ZYDIS_INSTRUCTION_ENCODING_3DNOW) {
    bVar43 = instruction->length;
    if (0xe < bVar43) {
      return 0x80200002;
    }
    if (state->buffer_len == 0) {
      return 0x80200000;
    }
    pZVar35 = state->buffer;
    state->buffer = pZVar35 + 1;
    instruction->opcode = *pZVar35;
    instruction->length = bVar43 + 1;
    state->buffer_len = state->buffer_len - 1;
    pZVar25 = ZydisDecoderTreeGetChildNode(&zydis_decoder_tree_root,0xf);
    pZVar25 = ZydisDecoderTreeGetChildNode(pZVar25,0xf);
    pZVar25 = ZydisDecoderTreeGetChildNode(pZVar25,(ushort)instruction->opcode);
    if (pZVar25->type == '\0') {
      return 0x80200001;
    }
    if (pZVar25->type != '\b') {
      __assert_fail("node->type == ZYDIS_NODETYPE_FILTER_MODRM_MOD_COMPACT",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x12db,
                    "ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *, ZydisDecodedInstruction *)"
                   );
    }
    pZVar25 = ZydisDecoderTreeGetChildNode(pZVar25,(ushort)((instruction->raw).modrm.mod != '\x03'))
    ;
    if (-1 < (char)pZVar25->type) {
      __assert_fail("node->type & ZYDIS_NODETYPE_DEFINITION_MASK",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x12de,
                    "ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *, ZydisDecodedInstruction *)"
                   );
    }
    ZydisGetInstructionDefinition
              (instruction->encoding,pZVar25->value,(ZydisInstructionDefinition **)&local_a8);
    local_50 = (ZydisMnemonic *)
               CONCAT44(local_a8._4_4_,
                        CONCAT13(local_a8._3_1_,
                                 CONCAT12(local_a8._2_1_,CONCAT11(local_a8._1_1_,(byte)local_a8))));
    pZVar49 = state->context;
  }
  instruction->mnemonic = *local_50 & (ZYDIS_MNEMONIC_VPSHLDVD|ZYDIS_MNEMONIC_PAVGB);
  instruction->operand_count = (byte)(*local_50 >> 0xb) & 0xf;
  instruction->operand_count_visible = (byte)(*local_50 >> 0xf) & 7;
  pZVar49->definition = local_50;
  puVar14 = (undefined8 *)
            CONCAT44(local_a8._4_4_,
                     CONCAT13(local_a8._3_1_,
                              CONCAT12(local_a8._2_1_,CONCAT11(local_a8._1_1_,(byte)local_a8))));
  ZVar22 = (ZydisInstructionCategory)((ulong)*puVar14 >> 0x2f) &
           (ZYDIS_CATEGORY_UNCOND_BR|ZYDIS_CATEGORY_DATAXFER);
  (instruction->meta).category = ZVar22;
  (instruction->meta).isa_set =
       (ZydisISASet)((ulong)*puVar14 >> 0x36) & (ZYDIS_ISA_SET_PAUSE|ZYDIS_ISA_SET_PADLOCK_RNG);
  (instruction->meta).isa_ext =
       (uint)((ulong)*puVar14 >> 0x3e) + *(int *)(puVar14 + 1) * 4 &
       (ZYDIS_ISA_EXT_SMAP|ZYDIS_ISA_EXT_SHA);
  ZVar31 = *(uint *)(puVar14 + 1) >> 5 & ZYDIS_BRANCH_TYPE_FAR;
  (instruction->meta).branch_type = ZVar31;
  if (((ZVar31 != ZYDIS_BRANCH_TYPE_NONE) &&
      ((0x37 < ZVar22 - ZYDIS_CATEGORY_CALL ||
       ((0x80000000000101U >> ((ulong)(ZVar22 - ZYDIS_CATEGORY_CALL) & 0x3f) & 1) == 0)))) &&
     (ZVar22 != ZYDIS_CATEGORY_UNCOND_BR)) {
    __assert_fail("(instruction->meta.branch_type == ZYDIS_BRANCH_TYPE_NONE) || ((instruction->meta.category == ZYDIS_CATEGORY_CALL) || (instruction->meta.category == ZYDIS_CATEGORY_COND_BR) || (instruction->meta.category == ZYDIS_CATEGORY_UNCOND_BR) || (instruction->meta.category == ZYDIS_CATEGORY_RET))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                  ,0x12f2,
                  "ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *, ZydisDecodedInstruction *)"
                 );
  }
  (instruction->meta).exception_class =
       *(uint *)(puVar14 + 1) >> 7 & (ZYDIS_EXCEPTION_CLASS_E10|ZYDIS_EXCEPTION_CLASS_E9NF);
  pZVar10 = state->decoder;
  if (pZVar10->decoder_mode[0] != '\0') {
    return 0x100000;
  }
  uVar37 = *(uint *)(puVar14 + 1);
  if ((uVar37 >> 0x17 & 3) != 0) {
    instruction->attributes =
         instruction->attributes |
         *(ulong *)(ZydisSetAttributes_mapping + (ulong)((byte)(uVar37 >> 0x17) & 3) * 8);
    uVar37 = *(uint *)(puVar14 + 1);
  }
  bVar43 = (byte)(uVar37 >> 0x19) & 3;
  if (bVar43 != 0) {
    instruction->attributes =
         instruction->attributes | *(ulong *)(ZydisSetAttributes_mapping_91 + (ulong)bVar43 * 8);
    uVar37 = *(uint *)(puVar14 + 1);
  }
  if ((uVar37 >> 0x1b & 3) != 0) {
    instruction->attributes =
         instruction->attributes |
         *(ulong *)(ZydisSetAttributes_mapping_93 + (ulong)((byte)(uVar37 >> 0x1b) & 3) * 8);
  }
  ZVar4 = instruction->encoding;
  if (ZVar4 - ZYDIS_INSTRUCTION_ENCODING_3DNOW < 5) {
    if ((*(byte *)((long)puVar14 + 0xb) & 0x20) != 0) {
      uVar26 = instruction->attributes;
      uVar40 = uVar26 | 0x4000000;
      instruction->attributes = uVar40;
      bVar43 = (state->prefixes).effective_segment;
      if (bVar43 < 0x36) {
        if (bVar43 != 0) {
          if (bVar43 == 0x26) {
            uVar40 = 0x10004000000;
          }
          else {
            if (bVar43 != 0x2e) goto LAB_0010ad75;
            uVar40 = 0x2004000000;
          }
          goto LAB_00109914;
        }
      }
      else {
        if (bVar43 < 100) {
          if (bVar43 == 0x36) {
            uVar40 = 0x4004000000;
          }
          else {
            if (bVar43 != 0x3e) {
LAB_0010ad75:
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                            ,0x8c8,
                            "void ZydisSetAttributes(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                           );
            }
            uVar40 = 0x8004000000;
          }
        }
        else if (bVar43 == 100) {
          uVar40 = 0x20004000000;
        }
        else {
          if (bVar43 != 0x65) goto LAB_0010ad75;
          uVar40 = 0x40004000000;
        }
LAB_00109914:
        uVar40 = uVar40 | uVar26;
        instruction->attributes = uVar40;
      }
      if ((uVar40 & 0x7e000000000) != 0) goto LAB_0010992a;
    }
  }
  else {
    if (ZVar4 != ZYDIS_INSTRUCTION_ENCODING_LEGACY) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x8d3,
                    "void ZydisSetAttributes(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    uVar37 = *(uint *)(puVar14 + 1);
    if ((uVar37 >> 0x1e & 1) != 0) {
      pbVar9 = (byte *)((long)&instruction->attributes + 1);
      *pbVar9 = *pbVar9 | 1;
      uVar37 = *(uint *)(puVar14 + 1);
    }
    if ((int)uVar37 < 0) {
      uVar26 = instruction->attributes;
      instruction->attributes = uVar26 | 0x10000;
      if ((state->prefixes).has_lock != '\0') {
        instruction->attributes = uVar26 | 0x8010000;
        (instruction->raw).prefixes[(state->prefixes).offset_lock].type =
             ZYDIS_PREFIX_TYPE_EFFECTIVE;
      }
    }
    uVar19 = *(ushort *)((long)puVar14 + 0xc);
    if ((uVar19 & 1) != 0) {
      pbVar9 = (byte *)((long)&instruction->attributes + 2);
      *pbVar9 = *pbVar9 | 2;
      uVar19 = *(ushort *)((long)puVar14 + 0xc);
    }
    if ((uVar19 & 2) != 0) {
      pbVar9 = (byte *)((long)&instruction->attributes + 2);
      *pbVar9 = *pbVar9 | 4;
      uVar19 = *(ushort *)((long)puVar14 + 0xc);
    }
    if ((uVar19 & 4) != 0) {
      pbVar9 = (byte *)((long)&instruction->attributes + 2);
      *pbVar9 = *pbVar9 | 8;
      uVar19 = *(ushort *)((long)puVar14 + 0xc);
    }
    if ((uVar19 & 8) != 0) {
      pbVar9 = (byte *)((long)&instruction->attributes + 2);
      *pbVar9 = *pbVar9 | 0x10;
      uVar19 = *(ushort *)((long)puVar14 + 0xc);
    }
    if ((uVar19 & 0x10) != 0) {
      pbVar9 = (byte *)((long)&instruction->attributes + 2);
      *pbVar9 = *pbVar9 | 0x20;
      uVar19 = *(ushort *)((long)puVar14 + 0xc);
    }
    cVar44 = (char)uVar19;
    if ((uVar19 & 0x20) != 0) {
      pbVar9 = (byte *)((long)&instruction->attributes + 2);
      *pbVar9 = *pbVar9 | 0x40;
      cVar44 = (char)*(undefined2 *)((long)puVar14 + 0xc);
    }
    if (cVar44 < '\0') {
      pbVar9 = (byte *)((long)&instruction->attributes + 2);
      *pbVar9 = *pbVar9 | 0x80;
    }
    ZVar15 = (state->prefixes).group1;
    if (ZVar15 == 0xf3) {
      uVar26 = instruction->attributes;
      uVar37 = (uint)uVar26;
      if ((uVar37 >> 0x11 & 1) == 0) {
        if ((uVar37 >> 0x12 & 1) == 0) {
          if (((uVar37 >> 0x16 & 1) == 0) ||
             (((uVar37 >> 0x1b & 1) == 0 && ((*(byte *)((long)puVar14 + 0xc) & 0x80) == 0))))
          goto LAB_00109f86;
          uVar26 = uVar26 | 0x200000000;
        }
        else {
          uVar26 = uVar26 | 0x20000000;
        }
      }
      else {
        uVar26 = uVar26 | 0x10000000;
      }
LAB_00109f82:
      instruction->attributes = uVar26;
    }
    else if (ZVar15 == 0xf2) {
      uVar26 = instruction->attributes;
      uVar37 = (uint)uVar26;
      if ((uVar37 >> 0x13 & 1) == 0) {
        if (((uVar37 >> 0x15 & 1) == 0) ||
           (((uVar37 >> 0x1b & 1) == 0 && ((*(byte *)((long)puVar14 + 0xc) & 0x80) == 0)))) {
          if (((uVar37 >> 0x14 & 1) == 0) || (pZVar10->decoder_mode[3] == '\0')) goto LAB_00109f86;
          uVar26 = uVar26 | 0x80000000;
        }
        else {
          uVar26 = uVar26 | 0x100000000;
        }
      }
      else {
        uVar26 = uVar26 | 0x40000000;
      }
      goto LAB_00109f82;
    }
LAB_00109f86:
    bVar43 = (state->prefixes).offset_group1;
    if (((instruction->raw).prefixes[bVar43].type == ZYDIS_PREFIX_TYPE_IGNORED) &&
       ((instruction->attributes & 0x3f0000000) != 0)) {
      (instruction->raw).prefixes[bVar43].type = ZYDIS_PREFIX_TYPE_EFFECTIVE;
    }
    if ((*(byte *)((long)puVar14 + 0xd) & 1) != 0) {
      uVar26 = instruction->attributes;
      instruction->attributes = uVar26 | 0x1000000;
      ZVar15 = (state->prefixes).group2;
      if (ZVar15 == '.') {
        uVar40 = 0x401000000;
      }
      else {
        if (ZVar15 != '>') goto LAB_00109ffe;
        uVar40 = 0x801000000;
      }
      instruction->attributes = uVar40 | uVar26;
      (instruction->raw).prefixes[(state->prefixes).offset_group2].type =
           ZYDIS_PREFIX_TYPE_EFFECTIVE;
    }
LAB_00109ffe:
    if ((*(byte *)((long)puVar14 + 0xc) & 0x40) != 0) {
      uVar26 = instruction->attributes;
      instruction->attributes = uVar26 | 0x2000000;
      if ((pZVar10->decoder_mode[4] != '\0') &&
         (lVar41 = (long)(state->prefixes).offset_notrack, -1 < lVar41)) {
        instruction->attributes = uVar26 | 0x1002000000;
        (instruction->raw).prefixes[lVar41].type = ZYDIS_PREFIX_TYPE_EFFECTIVE;
      }
    }
    if (((*(byte *)((long)puVar14 + 0xb) & 0x20) == 0) ||
       ((*(byte *)((long)puVar14 + 0xd) & 1) != 0)) goto switchD_00109951_default;
    uVar26 = instruction->attributes;
    uVar40 = uVar26 | 0x4000000;
    instruction->attributes = uVar40;
    bVar43 = (state->prefixes).effective_segment;
    if ((uVar26 >> 0x24 & 1) == 0 && bVar43 != 0) {
      if (bVar43 < 0x3e) {
        if (bVar43 == 0x26) {
          uVar40 = 0x10004000000;
        }
        else if (bVar43 == 0x2e) {
          uVar40 = 0x2004000000;
        }
        else {
          if (bVar43 != 0x36) {
LAB_0010b0d9:
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0x89d,
                          "void ZydisSetAttributes(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          uVar40 = 0x4004000000;
        }
      }
      else if (bVar43 == 0x3e) {
        uVar40 = 0x8004000000;
      }
      else if (bVar43 == 100) {
        uVar40 = 0x20004000000;
      }
      else {
        if (bVar43 != 0x65) goto LAB_0010b0d9;
        uVar40 = 0x40004000000;
      }
      uVar40 = uVar40 | uVar26;
      instruction->attributes = uVar40;
    }
    if ((uVar40 & 0x7e000000000) == 0) goto switchD_00109951_default;
LAB_0010992a:
    (instruction->raw).prefixes[(state->prefixes).offset_segment].type = ZYDIS_PREFIX_TYPE_EFFECTIVE
    ;
  }
  switch(ZVar4) {
  case ZYDIS_INSTRUCTION_ENCODING_XOP:
    uVar26 = (ulong)(pZVar49->vector_unified).LL;
    if (1 < uVar26) {
      __assert_fail("context->vector_unified.LL < (sizeof(lookup) / sizeof((lookup)[0]))",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x908,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    (instruction->avx).vector_length =
         *(ZyanU16 *)((long)&ZydisSetAVXInformation_lookup_96 + uVar26 * 2);
    goto switchD_00109951_default;
  case ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS:
    uVar26 = (ulong)(pZVar49->vector_unified).LL;
    if (1 < uVar26) {
      __assert_fail("context->vector_unified.LL < (sizeof(lookup) / sizeof((lookup)[0]))",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x914,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    (instruction->avx).vector_length =
         *(ZyanU16 *)((long)&ZydisSetAVXInformation_lookup_96 + uVar26 * 2);
    if ((*(ushort *)((long)puVar14 + 0xc) & 0x1c0) != 0) {
      (instruction->avx).broadcast.is_static = '\x01';
      (instruction->avx).broadcast.mode =
           *(ZydisBroadcastMode *)
            (ZydisSetAVXInformation_broadcasts +
            (ulong)(*(ushort *)((long)puVar14 + 0xc) >> 6 & 7) * 4);
    }
    goto switchD_00109951_default;
  case ZYDIS_INSTRUCTION_ENCODING_EVEX:
    bVar43 = (pZVar49->vector_unified).LL;
    bVar28 = *(byte *)((long)puVar14 + 0xc) >> 6;
    bVar29 = bVar28 - 1;
    if (bVar28 == 0) {
      bVar29 = bVar43;
    }
    if (2 < bVar29) {
      __assert_fail("vector_length < (sizeof(lookup) / sizeof((lookup)[0]))",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x93d,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    uVar26 = (ulong)bVar29;
    ZVar18 = *(ZyanU16 *)((long)&ZydisSetAVXInformation_lookup_97 + uVar26 * 2);
    (instruction->avx).vector_length = ZVar18;
    (pZVar49->evex).tuple_type = *(byte *)((long)puVar14 + 0xd) & 0x1f;
    bVar28 = *(byte *)((long)puVar14 + 0xd);
    ZVar15 = (instruction->raw).modrm.mod;
    if ((bVar28 & 0x1f) == 0) {
      if (ZVar15 != '\x03') {
        __assert_fail("instruction->raw.modrm.mod == 3",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xa79,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      goto LAB_0010a71e;
    }
    if (ZVar15 == '\x03') {
      __assert_fail("instruction->raw.modrm.mod != 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x943,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (bVar28 < 0x20) {
      __assert_fail("def->element_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x944,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (0xbf < bVar28) {
      __assert_fail("def->element_size < (sizeof(element_sizes) / sizeof((element_sizes)[0]))",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x94b,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    break;
  case ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE:
    (instruction->avx).vector_length = 0x200;
    uVar11 = *(uint3 *)((long)puVar14 + 0xc);
    if ((uVar11 & 0x1c000) != 0 && (uVar11 & 0x2000) != 0) {
      __assert_fail("!index || !def->broadcast",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xacd,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    uVar37 = uVar11 >> 0xd & 1;
    uVar26 = (ulong)uVar37;
    bVar50 = true;
    if ((char)uVar37 != '\0' || (uVar11 & 0x1c000) == 0) goto LAB_00109e3c;
    (instruction->avx).broadcast.is_static = '\x01';
    uVar37 = *(uint3 *)((long)puVar14 + 0xc) >> 0xe & 7;
    uVar26 = (ulong)uVar37;
    bVar50 = true;
    switch(uVar37) {
    case 1:
      ZVar39 = ZYDIS_BROADCAST_MODE_1_TO_8;
      break;
    case 2:
      uVar26 = 1;
      ZVar39 = ZYDIS_BROADCAST_MODE_1_TO_16;
      break;
    case 3:
      ZVar39 = ZYDIS_BROADCAST_MODE_4_TO_8;
      goto LAB_00109e20;
    case 4:
      ZVar39 = ZYDIS_BROADCAST_MODE_4_TO_16;
LAB_00109e20:
      uVar26 = 2;
      bVar50 = false;
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xae4,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    (instruction->avx).broadcast.mode = ZVar39;
    uVar11 = *(uint3 *)((long)puVar14 + 0xc);
LAB_00109e3c:
    bVar43 = (byte)(uVar11 >> 6);
    switch(uVar11 >> 6 & 0x1f) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 8:
    case 9:
      goto switchD_00109e5c_caseD_0;
    case 4:
    case 5:
    case 6:
    case 7:
      ZVar15 = '@';
      goto LAB_0010a25d;
    case 10:
    case 0xb:
    case 0xc:
    case 0x12:
      uVar40 = (ulong)(instruction->raw).mvex.SSS;
      if (7 < uVar40) {
        __assert_fail("instruction->raw.mvex.SSS < (sizeof(lookup[index]) / sizeof((lookup[index])[0]))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xb04,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      puVar33 = ZydisSetAVXInformation_lookup_130;
      break;
    case 0xd:
    case 0x11:
    case 0x13:
    case 0x15:
      uVar40 = (ulong)(instruction->raw).mvex.SSS;
      if (2 < uVar40) {
        __assert_fail("instruction->raw.mvex.SSS < (sizeof(lookup[index]) / sizeof((lookup[index])[0]))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xb22,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      uVar26 = uVar26 * 3;
      puVar34 = (undefined2 *)(ZydisSetAVXInformation_lookup_133 + uVar40);
      goto LAB_0010a258;
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x14:
      uVar40 = (ulong)(instruction->raw).mvex.SSS;
      if (7 < uVar40) {
        __assert_fail("instruction->raw.mvex.SSS < (sizeof(lookup[index]) / sizeof((lookup[index])[0]))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xb13,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      puVar33 = ZydisSetAVXInformation_lookup_132;
      break;
    case 0x16:
    case 0x18:
      if (!bVar50) {
        __assert_fail("index < 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xb2e,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      uVar40 = (ulong)(instruction->raw).mvex.SSS;
      if (7 < uVar40) {
        __assert_fail("instruction->raw.mvex.SSS < (sizeof(lookup[index]) / sizeof((lookup[index])[0]))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xb2f,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      puVar33 = ZydisSetAVXInformation_lookup_134;
      break;
    case 0x17:
    case 0x19:
      if (!bVar50) {
        __assert_fail("index < 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xb3b,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      if ((instruction->raw).mvex.SSS != '\0') {
        __assert_fail("instruction->raw.mvex.SSS < (sizeof(lookup[index]) / sizeof((lookup[index])[0]))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xb3c,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      puVar34 = &ZydisSetAVXInformation_lookup_136;
LAB_0010a258:
      pZVar35 = (ZyanU8 *)((long)puVar34 + uVar26);
      goto LAB_0010a25b;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xb41,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    pZVar35 = puVar33 + uVar40 + uVar26 * 8;
LAB_0010a25b:
    ZVar15 = *pZVar35;
LAB_0010a25d:
    pZVar49->cd8_scale = ZVar15;
    bVar43 = (byte)(*(ushort *)((long)puVar14 + 0xc) >> 6);
switchD_00109e5c_caseD_0:
    (pZVar49->mvex).functionality = bVar43 & 0x1f;
    switch(*(ushort *)((long)puVar14 + 0xc) >> 6 & 0x1f) {
    case 0:
    case 1:
    case 4:
    case 5:
    case 6:
    case 7:
    case 0x13:
    case 0x15:
    case 0x17:
    case 0x19:
      break;
    case 2:
      bVar43 = (instruction->raw).mvex.SSS;
      (instruction->avx).rounding.mode = (bVar43 & 3) + ZYDIS_ROUNDING_MODE_RN;
      goto LAB_0010a681;
    case 3:
      bVar43 = (instruction->raw).mvex.SSS;
LAB_0010a681:
      if (3 < bVar43) {
        (instruction->avx).has_sae = '\x01';
      }
      break;
    case 8:
    case 9:
      (instruction->avx).swizzle.mode = (instruction->raw).mvex.SSS + ZYDIS_SWIZZLE_MODE_DCBA;
      break;
    case 10:
    case 0xb:
    case 0xc:
      switch((instruction->raw).mvex.SSS) {
      case '\0':
        break;
      case '\x01':
switchD_0010a304_caseD_1:
        (instruction->avx).broadcast.mode = ZYDIS_BROADCAST_MODE_1_TO_16;
        break;
      case '\x02':
switchD_0010a304_caseD_2:
        (instruction->avx).broadcast.mode = ZYDIS_BROADCAST_MODE_4_TO_16;
        break;
      case '\x03':
switchD_0010a36c_caseD_3:
        (instruction->avx).conversion.mode = ZYDIS_CONVERSION_MODE_FLOAT16;
        break;
      case '\x04':
switchD_0010a399_caseD_4:
        (instruction->avx).conversion.mode = ZYDIS_CONVERSION_MODE_REQUIRED_BITS;
        break;
      case '\x05':
switchD_0010a399_caseD_5:
        (instruction->avx).conversion.mode = ZYDIS_CONVERSION_MODE_SINT8;
        break;
      case '\x06':
switchD_0010a399_caseD_6:
        (instruction->avx).conversion.mode = ZYDIS_CONVERSION_MODE_MAX_VALUE;
        break;
      case '\a':
switchD_0010a399_caseD_7:
        (instruction->avx).conversion.mode = ZYDIS_CONVERSION_MODE_SINT16;
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xb7a,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      break;
    case 0xd:
    case 0x11:
      ZVar15 = (instruction->raw).mvex.SSS;
      if (ZVar15 != '\0') {
        if (ZVar15 == '\x02') {
          (instruction->avx).broadcast.mode = ZYDIS_BROADCAST_MODE_4_TO_8;
        }
        else {
          if (ZVar15 != '\x01') {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                          ,0xba7,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          (instruction->avx).broadcast.mode = ZYDIS_BROADCAST_MODE_1_TO_8;
        }
      }
      break;
    case 0xe:
    case 0xf:
    case 0x10:
      switch((instruction->raw).mvex.SSS) {
      case '\0':
        break;
      case '\x01':
        goto switchD_0010a304_caseD_1;
      case '\x02':
        goto switchD_0010a304_caseD_2;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xb97,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      case '\x04':
        goto switchD_0010a399_caseD_4;
      case '\x05':
        goto switchD_0010a399_caseD_5;
      case '\x06':
        goto switchD_0010a399_caseD_6;
      case '\a':
        goto switchD_0010a399_caseD_7;
      }
    case 0x12:
    case 0x16:
      switch((instruction->raw).mvex.SSS) {
      case '\0':
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xbc0,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      case '\x03':
        goto switchD_0010a36c_caseD_3;
      case '\x04':
        goto switchD_0010a399_caseD_4;
      case '\x05':
        goto switchD_0010a399_caseD_5;
      case '\x06':
        goto switchD_0010a399_caseD_6;
      case '\a':
        goto switchD_0010a399_caseD_7;
      }
    case 0x14:
    case 0x18:
      switch((instruction->raw).mvex.SSS) {
      case '\0':
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xbd9,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      case '\x04':
        goto switchD_0010a399_caseD_4;
      case '\x05':
        goto switchD_0010a399_caseD_5;
      case '\x06':
        goto switchD_0010a399_caseD_6;
      case '\a':
        goto switchD_0010a399_caseD_7;
      }
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xbe0,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (((instruction->raw).modrm.mod != '\x03') && ((instruction->raw).mvex.E != '\0')) {
      (instruction->avx).has_eviction_hint = '\x01';
    }
    (instruction->avx).mask.mode = ZYDIS_MASK_MODE_MERGING;
    (instruction->avx).mask.reg = (instruction->raw).mvex.kkk + ZYDIS_REGISTER_K0;
  default:
    goto switchD_00109951_default;
  }
  bVar45 = bVar28 >> 5;
  bVar36 = *(byte *)((long)&ZydisSetAVXInformation_element_sizes + (ulong)bVar45);
  (pZVar49->evex).element_size = bVar36;
  bVar47 = *(byte *)((long)puVar14 + 0xd);
  switch(bVar47 & 0x1f) {
  case 1:
    uVar40 = (ulong)(instruction->raw).evex.b;
    if (1 < uVar40) {
      __assert_fail("evex_b < 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x954,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (uVar40 != 0) {
      bVar50 = (bVar28 & 0xc0) != 0x40;
      if ((pZVar49->vector_unified).W != '\0') {
        bVar50 = bVar45 != 4;
      }
      if (bVar50) {
        __assert_fail("!evex_b || ((!context->vector_unified.W && (context->evex.element_size == 16 || context->evex.element_size == 32)) || ( context->vector_unified.W && context->evex.element_size == 64))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0x957,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      if ((*(ushort *)((long)puVar14 + 0xe) & 3) != 1) {
        __assert_fail("!evex_b || def->functionality == ZYDIS_EVEX_FUNC_BC",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0x958,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
    }
    if (bVar45 == 5) {
      __assert_fail("size_index < 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x98e,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    pZVar49->cd8_scale =
         ZydisSetAVXInformation_scales[uVar26 + (ulong)(bVar36 >> 5) * 3 + uVar40 * 9];
    puVar33 = ZydisSetAVXInformation_broadcasts_104 + (ulong)(bVar36 >> 5) * 0xc + uVar40 * 0x24;
    goto LAB_0010a65d;
  case 2:
    uVar40 = (ulong)(instruction->raw).evex.b;
    if (1 < uVar40) {
      __assert_fail("evex_b < 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x997,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if ((pZVar49->vector_unified).W != '\0') {
      __assert_fail("!context->vector_unified.W",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x998,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if ((bVar28 & 0xc0) != 0x40) {
      __assert_fail("(context->evex.element_size == 16) || (context->evex.element_size == 32)",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x99a,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if ((uVar40 != 0) && ((*(ushort *)((long)puVar14 + 0xe) & 3) != 1)) {
      __assert_fail("!evex_b || def->functionality == ZYDIS_EVEX_FUNC_BC",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x99b,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (bVar45 == 5) {
      __assert_fail("size_index < 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x9c5,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    lVar41 = (ulong)(bVar36 >> 5) * 3;
    pZVar49->cd8_scale = ZydisSetAVXInformation_scales_108[uVar26 + lVar41 + uVar40 * 6];
    puVar33 = ZydisSetAVXInformation_broadcasts_109 + uVar40 * 0x18;
    goto LAB_0010a659;
  case 3:
    puVar42 = &ZydisSetAVXInformation_scales_110;
    break;
  case 4:
    goto switchD_00109a26_caseD_4;
  case 5:
    if (bVar45 == 5) {
      __assert_fail("size_index < 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0x9fa,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    ZVar15 = *(ZyanU8 *)((long)&ZydisSetAVXInformation_scales_120 + (ulong)(bVar36 >> 5));
    goto LAB_0010a71a;
  case 6:
    if (bVar45 != 3) {
      __assert_fail("context->evex.element_size == 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xa00,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if ((pZVar49->vector_unified).W != '\0') {
      __assert_fail("context->vector_unified.W == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xa01,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
  case 0xe:
switchD_00109a26_caseD_e:
    pZVar49->cd8_scale = '\x10';
    goto LAB_0010a71e;
  case 7:
    ZVar15 = (pZVar49->vector_unified).W;
    if (ZVar15 == '\x01') {
      if (bVar45 != 4) {
        __assert_fail("context->evex.element_size == 64",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0x9db,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
    }
    else {
      if (ZVar15 != '\0') {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0x9de,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      if (bVar45 != 3) {
        __assert_fail("context->evex.element_size == 32",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0x9d8,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
    }
    goto switchD_00109a26_caseD_4;
  case 8:
    ZVar15 = (pZVar49->vector_unified).W;
    if (ZVar15 != '\x01') {
      if (ZVar15 != '\0') {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xa12,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      if (bVar45 != 3) {
        __assert_fail("context->evex.element_size == 32",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xa08,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      pZVar49->cd8_scale = '\b';
      goto LAB_0010a71e;
    }
    if (bVar45 != 4) {
      __assert_fail("context->evex.element_size == 64",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xa0c,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if ((ZVar18 != 0x100) && (ZVar18 != 0x200)) {
      __assert_fail("(instruction->avx.vector_length == 256) || (instruction->avx.vector_length == 512)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xa0e,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    goto switchD_00109a26_caseD_e;
  case 9:
    ZVar15 = (pZVar49->vector_unified).W;
    if (ZVar15 == '\x01') {
      if (bVar45 != 4) {
        __assert_fail("context->evex.element_size == 64",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xa1f,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      if (bVar29 != 2) {
        __assert_fail("instruction->avx.vector_length == 512",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                      ,0xa20,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      goto LAB_0010a855;
    }
    if (ZVar15 != '\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xa24,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (bVar45 != 3) {
      __assert_fail("context->evex.element_size == 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xa19,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if ((ZVar18 != 0x100) && (ZVar18 != 0x200)) {
      __assert_fail("(instruction->avx.vector_length == 256) || (instruction->avx.vector_length == 512)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xa1b,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    goto switchD_00109a26_caseD_e;
  case 10:
    if ((pZVar49->vector_unified).W != '\0') {
      __assert_fail("!context->vector_unified.W",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xa28,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (bVar29 != 2) {
      __assert_fail("instruction->avx.vector_length == 512",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xa29,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (bVar45 != 3) {
      __assert_fail("context->evex.element_size == 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xa2a,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
LAB_0010a855:
    pZVar49->cd8_scale = ' ';
    goto LAB_0010a71e;
  case 0xb:
    puVar42 = &ZydisSetAVXInformation_scales_118;
    break;
  case 0xc:
    puVar42 = &ZydisSetAVXInformation_scales_119;
    break;
  case 0xd:
    puVar42 = &ZydisSetAVXInformation_scales_120;
    break;
  case 0xf:
    puVar42 = &ZydisSetAVXInformation_scales_121;
    break;
  case 0x10:
    uVar40 = (ulong)(instruction->raw).evex.b;
    if (1 < uVar40) {
      __assert_fail("evex_b < 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xa57,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if ((pZVar49->vector_unified).W != '\0') {
      __assert_fail("!context->vector_unified.W",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xa58,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (bVar45 != 2) {
      __assert_fail("context->evex.element_size == 16",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xa59,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if ((uVar40 != 0) && ((*(ushort *)((long)puVar14 + 0xe) & 3) != 1)) {
      __assert_fail("!evex_b || def->functionality == ZYDIS_EVEX_FUNC_BC",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xa5a,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    lVar41 = uVar40 * 3;
    pZVar49->cd8_scale = *(ZyanU8 *)((long)&ZydisSetAVXInformation_scales_123 + uVar26 + lVar41);
    puVar33 = ZydisSetAVXInformation_broadcasts_124;
LAB_0010a659:
    puVar33 = puVar33 + lVar41 * 4;
LAB_0010a65d:
    (instruction->avx).broadcast.mode = *(ZydisBroadcastMode *)(puVar33 + uVar26 * 4);
    goto LAB_0010a71e;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                  ,0xa75,
                  "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  ZVar15 = *(ZyanU8 *)(uVar26 + (long)puVar42);
LAB_0010a71a:
  pZVar49->cd8_scale = ZVar15;
LAB_0010a71e:
  if ((*(ushort *)((long)puVar14 + 0xe) & 0x780) != 0) {
    if ((instruction->avx).broadcast.mode != ZYDIS_BROADCAST_MODE_INVALID) {
      __assert_fail("!instruction->avx.broadcast.mode",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xa7f,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    (instruction->avx).broadcast.is_static = '\x01';
    uVar37 = *(ushort *)((long)puVar14 + 0xe) >> 7 & 0xf;
    if (0xc < (ushort)uVar37) {
      __assert_fail("def->broadcast < (sizeof(broadcasts) / sizeof((broadcasts)[0]))",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                    ,0xa91,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    (instruction->avx).broadcast.mode =
         *(ZydisBroadcastMode *)(ZydisSetAVXInformation_broadcasts_127 + (ulong)uVar37 * 4);
  }
  if (((instruction->raw).evex.b != '\0') &&
     (uVar19 = *(ushort *)((long)puVar14 + 0xe) & 3, 1 < uVar19)) {
    if (uVar19 != 3) {
      (instruction->avx).rounding.mode = bVar43 + ZYDIS_ROUNDING_MODE_RN;
    }
    (instruction->avx).has_sae = '\x01';
  }
  bVar43 = (instruction->raw).evex.aaa;
  (instruction->avx).mask.reg = bVar43 + ZYDIS_REGISTER_K0;
  switch(*(ushort *)((long)puVar14 + 0xe) >> 5 & 3) {
  case 0:
    iVar32 = 2;
    break;
  case 1:
    ZVar30 = ZYDIS_MASK_MODE_REQUIRED_BITS;
    goto LAB_0010a7c1;
  case 2:
    iVar32 = 4;
    break;
  case 3:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zydis/src/Decoder.c"
                  ,0xab7,
                  "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  ZVar30 = (uint)(instruction->raw).evex.z + iVar32;
LAB_0010a7c1:
  ZVar23 = ZYDIS_MASK_MODE_DISABLED;
  if (bVar43 != 0) {
    ZVar23 = ZVar30;
  }
  (instruction->avx).mask.mode = ZVar23;
switchD_00109951_default:
  ZVar16 = ZydisGetAccessedFlags
                     ((ZydisInstructionDefinition *)
                      CONCAT44(local_a8._4_4_,
                               CONCAT13(local_a8._3_1_,
                                        CONCAT12(local_a8._2_1_,
                                                 CONCAT11(local_a8._1_1_,(byte)local_a8)))),
                      &local_40);
  if (ZVar16 != '\0') {
    pbVar9 = (byte *)((long)&instruction->attributes + 1);
    *pbVar9 = *pbVar9 | 2;
    instruction->cpu_flags = &local_40->cpu_flags;
    instruction->fpu_flags = &local_40->fpu_flags;
  }
  return 0x100000;
}

Assistant:

static ZyanStatus ZydisDecodeInstruction(ZydisDecoderState* state,
    ZydisDecodedInstruction* instruction)
{
    ZYAN_ASSERT(state);
    ZYAN_ASSERT(instruction);

    // Iterate through the decoder tree
    const ZydisDecoderTreeNode* node = ZydisDecoderTreeGetRootNode();
    const ZydisDecoderTreeNode* temp = ZYAN_NULL;
    ZydisDecoderTreeNodeType node_type;
    do
    {
        node_type = node->type;
        ZyanU16 index = 0;
        ZyanStatus status = 0;
        switch (node_type)
        {
        case ZYDIS_NODETYPE_INVALID:
            if (temp)
            {
                node = temp;
                temp = ZYAN_NULL;
                node_type = ZYDIS_NODETYPE_FILTER_MANDATORY_PREFIX;
                if (state->prefixes.mandatory_candidate != 0x00)
                {
                    instruction->raw.prefixes[state->prefixes.offset_mandatory].type =
                        ZYDIS_PREFIX_TYPE_IGNORED;
                }
                if (state->prefixes.mandatory_candidate == 0x66)
                {
                    if (state->prefixes.offset_osz_override ==
                        state->prefixes.offset_mandatory)
                    {
                        instruction->raw.prefixes[state->prefixes.offset_mandatory].type =
                            ZYDIS_PREFIX_TYPE_EFFECTIVE;
                    }
                    instruction->attributes |= ZYDIS_ATTRIB_HAS_OPERANDSIZE;
                }
                continue;
            }
            return ZYDIS_STATUS_DECODING_ERROR;
        case ZYDIS_NODETYPE_FILTER_XOP:
            status = ZydisNodeHandlerXOP(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_VEX:
            status = ZydisNodeHandlerVEX(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_EMVEX:
            status = ZydisNodeHandlerEMVEX(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_OPCODE:
            status = ZydisNodeHandlerOpcode(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODE:
            status = ZydisNodeHandlerMode(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_COMPACT:
            status = ZydisNodeHandlerModeCompact(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODRM_MOD:
            status = ZydisNodeHandlerModrmMod(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODRM_MOD_COMPACT:
            status = ZydisNodeHandlerModrmModCompact(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODRM_REG:
            status = ZydisNodeHandlerModrmReg(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODRM_RM:
            status = ZydisNodeHandlerModrmRm(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_PREFIX_GROUP1:
            index = state->prefixes.group1 ? 1 : 0;
            break;
        case ZYDIS_NODETYPE_FILTER_MANDATORY_PREFIX:
            status = ZydisNodeHandlerMandatoryPrefix(state, instruction, &index);
            temp = ZydisDecoderTreeGetChildNode(node, 0);
            // TODO: Return to this point, if index == 0 contains a value and the previous path
            // TODO: was not successful
            // TODO: Restore consumed prefix
            break;
        case ZYDIS_NODETYPE_FILTER_OPERAND_SIZE:
            status = ZydisNodeHandlerOperandSize(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_ADDRESS_SIZE:
            status = ZydisNodeHandlerAddressSize(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_VECTOR_LENGTH:
            status = ZydisNodeHandlerVectorLength(state->context, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_REX_W:
            status = ZydisNodeHandlerRexW(state->context, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_REX_B:
            status = ZydisNodeHandlerRexB(state->context, instruction, &index);
            break;
#ifndef ZYDIS_DISABLE_AVX512
        case ZYDIS_NODETYPE_FILTER_EVEX_B:
            status = ZydisNodeHandlerEvexB(instruction, &index);
            break;
#endif
#ifndef ZYDIS_DISABLE_KNC
        case ZYDIS_NODETYPE_FILTER_MVEX_E:
            status = ZydisNodeHandlerMvexE(instruction, &index);
            break;
#endif
        case ZYDIS_NODETYPE_FILTER_MODE_AMD:
            index = state->decoder->decoder_mode[ZYDIS_DECODER_MODE_AMD_BRANCHES] ? 1 : 0;
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_KNC:
            index = state->decoder->decoder_mode[ZYDIS_DECODER_MODE_KNC] ? 1 : 0;
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_MPX:
            index = state->decoder->decoder_mode[ZYDIS_DECODER_MODE_MPX] ? 1 : 0;
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_CET:
            index = state->decoder->decoder_mode[ZYDIS_DECODER_MODE_CET] ? 1 : 0;
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_LZCNT:
            index = state->decoder->decoder_mode[ZYDIS_DECODER_MODE_LZCNT] ? 1 : 0;
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_TZCNT:
            index = state->decoder->decoder_mode[ZYDIS_DECODER_MODE_TZCNT] ? 1 : 0;
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_WBNOINVD:
            index = state->decoder->decoder_mode[ZYDIS_DECODER_MODE_WBNOINVD] ? 1 : 0;
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_CLDEMOTE:
            index = state->decoder->decoder_mode[ZYDIS_DECODER_MODE_CLDEMOTE] ? 1 : 0;
            break;
        default:
            if (node_type & ZYDIS_NODETYPE_DEFINITION_MASK)
            {
                const ZydisInstructionDefinition* definition;
                ZydisGetInstructionDefinition(instruction->encoding, node->value, &definition);
                ZydisSetEffectiveOperandWidth(state->context, instruction, definition);
                ZydisSetEffectiveAddressWidth(state->context, instruction, definition);

                const ZydisInstructionEncodingInfo* info;
                ZydisGetInstructionEncodingInfo(node, &info);
                ZYAN_CHECK(ZydisDecodeOptionalInstructionParts(state, instruction, info));
                ZYAN_CHECK(ZydisCheckErrorConditions(state, instruction, definition));

                if (instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_3DNOW)
                {
                    // Get actual 3DNOW opcode and definition
                    ZYAN_CHECK(ZydisInputNext(state, instruction, &instruction->opcode));
                    node = ZydisDecoderTreeGetRootNode();
                    node = ZydisDecoderTreeGetChildNode(node, 0x0F);
                    node = ZydisDecoderTreeGetChildNode(node, 0x0F);
                    node = ZydisDecoderTreeGetChildNode(node, instruction->opcode);
                    if (node->type == ZYDIS_NODETYPE_INVALID)
                    {
                        return ZYDIS_STATUS_DECODING_ERROR;
                    }
                    ZYAN_ASSERT(node->type == ZYDIS_NODETYPE_FILTER_MODRM_MOD_COMPACT);
                    node = ZydisDecoderTreeGetChildNode(
                        node, (instruction->raw.modrm.mod == 0x3) ? 0 : 1);
                    ZYAN_ASSERT(node->type & ZYDIS_NODETYPE_DEFINITION_MASK);
                    ZydisGetInstructionDefinition(instruction->encoding, node->value, &definition);
                }

                instruction->mnemonic = definition->mnemonic;

#ifndef ZYDIS_MINIMAL_MODE

                instruction->operand_count = definition->operand_count;
                instruction->operand_count_visible = definition->operand_count_visible;
                state->context->definition = definition;

                instruction->meta.category = definition->category;
                instruction->meta.isa_set = definition->isa_set;
                instruction->meta.isa_ext = definition->isa_ext;
                instruction->meta.branch_type = definition->branch_type;
                ZYAN_ASSERT((instruction->meta.branch_type == ZYDIS_BRANCH_TYPE_NONE) ||
                        ((instruction->meta.category == ZYDIS_CATEGORY_CALL) ||
                         (instruction->meta.category == ZYDIS_CATEGORY_COND_BR) ||
                         (instruction->meta.category == ZYDIS_CATEGORY_UNCOND_BR) ||
                         (instruction->meta.category == ZYDIS_CATEGORY_RET)));
                instruction->meta.exception_class = definition->exception_class;

                if (!state->decoder->decoder_mode[ZYDIS_DECODER_MODE_MINIMAL])
                {
                    ZydisSetAttributes(state, instruction, definition);
                    switch (instruction->encoding)
                    {
                    case ZYDIS_INSTRUCTION_ENCODING_XOP:
                    case ZYDIS_INSTRUCTION_ENCODING_VEX:
                    case ZYDIS_INSTRUCTION_ENCODING_EVEX:
                    case ZYDIS_INSTRUCTION_ENCODING_MVEX:
                        ZydisSetAVXInformation(state->context, instruction, definition);
                        break;
                    default:
                        break;
                    }

                    const ZydisDefinitionAccessedFlags* flags;
                    if (ZydisGetAccessedFlags(definition, &flags))
                    {
                        instruction->attributes |= ZYDIS_ATTRIB_CPUFLAG_ACCESS;
                        instruction->cpu_flags = &flags->cpu_flags;
                        instruction->fpu_flags = &flags->fpu_flags;
                    }
                }

#endif

                return ZYAN_STATUS_SUCCESS;
            }
            ZYAN_UNREACHABLE;
        }
        ZYAN_CHECK(status);
        node = ZydisDecoderTreeGetChildNode(node, index);
    } while ((node_type != ZYDIS_NODETYPE_INVALID) && !(node_type & ZYDIS_NODETYPE_DEFINITION_MASK));
    return ZYAN_STATUS_SUCCESS;
}